

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createOpConstantNullTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  long lVar3;
  NameConstantsCode *name;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  byte bVar7;
  allocator<char> local_460;
  allocator<char> local_45f;
  allocator<char> local_45e;
  allocator<char> local_45d;
  allocator<char> local_45c;
  allocator<char> local_45b;
  allocator<char> local_45a;
  allocator<char> local_459;
  allocator<char> local_458;
  allocator<char> local_457;
  allocator<char> local_456;
  allocator<char> local_455;
  allocator<char> local_454;
  allocator<char> local_453;
  allocator<char> local_452;
  allocator<char> local_451;
  key_type local_450;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opConstantNullTests;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  RGBA colors [4];
  key_type local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  char functionEnd [48];
  NameConstantsCode tests [7];
  char functionStart [108];
  
  bVar7 = 0;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"opconstantnull","OpConstantNull instruction");
  colors[0].m_value = 0;
  colors[1].m_value = 0;
  colors[2].m_value = 0;
  colors[3].m_value = 0;
  pcVar4 = 
  "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1 = OpFunctionParameter %v4f32\n%lbl    = OpLabel\n"
  ;
  pcVar5 = functionStart;
  for (lVar3 = 0x6c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar5 = *pcVar4;
    pcVar4 = pcVar4 + (ulong)bVar7 * -2 + 1;
    pcVar5 = pcVar5 + (ulong)bVar7 * -2 + 1;
  }
  builtin_strncpy(functionEnd + 0x20,"\nOpFunctionEnd\n",0x10);
  builtin_strncpy(functionEnd + 0x10,"ransformed_param",0x10);
  builtin_strncpy(functionEnd,"OpReturnValue %t",0x10);
  name = tests;
  opConstantNullTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name,"vec4",(allocator<char> *)&fragments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].constants,"%cnull = OpConstantNull %v4f32\n",
             (allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].code,"%transformed_param = OpFAdd %v4f32 %param1 %cnull\n",
             (allocator<char> *)&local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 1),"float",(allocator<char> *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].constants,"%cnull = OpConstantNull %f32\n",
             (allocator<char> *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].code,
             "%vp = OpVariable %fp_v4f32 Function\n%v  = OpLoad %v4f32 %vp\n%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
             ,&local_45f);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 2),"bool",&local_460);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].constants,"%cnull             = OpConstantNull %bool\n",&local_451)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].code,
             "%v                 = OpVariable %fp_v4f32 Function\n                     OpStore %v %param1\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %cnull %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,&local_452);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 3),"i32",&local_453);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].constants,"%cnull             = OpConstantNull %i32\n",&local_454);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].code,
             "%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n%b                 = OpIEqual %bool %cnull %c_i32_0\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %b %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %param1\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,&local_455);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 4),"struct",&local_456);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].constants,
             "%stype             = OpTypeStruct %f32 %v4f32\n%fp_stype          = OpTypePointer Function %stype\n%cnull             = OpConstantNull %stype\n"
             ,&local_457);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].code,
             "%v                 = OpVariable %fp_stype Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n%f_val             = OpLoad %v4f32 %f\n%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
             ,&local_458);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 5),"array",&local_459);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[5].constants,
             "%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n%cnull             = OpConstantNull %a4_v4f32\n"
             ,&local_45a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[5].code,
             "%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n%f_val             = OpLoad %v4f32 %f\n%f1_val            = OpLoad %v4f32 %f1\n%f2_val            = OpLoad %v4f32 %f2\n%f3_val            = OpLoad %v4f32 %f3\n%t0                = OpFAdd %v4f32 %param1 %f_val\n%t1                = OpFAdd %v4f32 %t0 %f1_val\n%t2                = OpFAdd %v4f32 %t1 %f2_val\n%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
             ,&local_45b);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 6),"matrix",&local_45c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[6].constants,
             "%mat4x4_f32        = OpTypeMatrix %v4f32 4\n%cnull             = OpConstantNull %mat4x4_f32\n"
             ,&local_45d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[6].code,
             "%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n%transformed_param = OpFAdd %v4f32 %param1 %v\n"
             ,&local_45e);
  getHalfColorsFullAlpha(&colors);
  lVar3 = 7;
  while (pTVar1 = opConstantNullTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.ptr, bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"pre_main",(allocator<char> *)&local_398);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_450);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,functionStart,&local_45f);
    std::operator+(&local_398,&local_3b8,&name->code);
    std::operator+(&local_450,&local_398,functionEnd);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"testfun",&local_460);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fragments._M_t,&local_3d8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_450);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    local_450._M_string_length = 0;
    local_450.field_2._M_local_buf[0] = '\0';
    createTestsForAllStages
              (&name->name,&colors,&colors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments._M_t,
               opConstantNullTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr,QP_TEST_RESULT_FAIL,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    name = name + 1;
  }
  opConstantNullTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  lVar3 = 0x240;
  do {
    createOpConstantNullTests::NameConstantsCode::~NameConstantsCode
              ((NameConstantsCode *)((long)&tests[0].name._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x60;
  } while (lVar3 != -0x60);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&opConstantNullTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createOpConstantNullTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantNullTests		(new tcu::TestCaseGroup(testCtx, "opconstantnull", "OpConstantNull instruction"));
	RGBA							colors[4];


	const char						functionStart[] =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]	=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",
			"%cnull = OpConstantNull %v4f32\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cnull\n"
		},
		{
			"float",
			"%cnull = OpConstantNull %f32\n",
			"%vp = OpVariable %fp_v4f32 Function\n"
			"%v  = OpLoad %v4f32 %vp\n"
			"%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n"
			"%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n"
			"%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n"
			"%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
		},
		{
			"bool",
			"%cnull             = OpConstantNull %bool\n",
			"%v                 = OpVariable %fp_v4f32 Function\n"
			"                     OpStore %v %param1\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %cnull %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"i32",
			"%cnull             = OpConstantNull %i32\n",
			"%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n"
			"%b                 = OpIEqual %bool %cnull %c_i32_0\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %b %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %param1\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"struct",
			"%stype             = OpTypeStruct %f32 %v4f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%cnull             = OpConstantNull %stype\n",
			"%v                 = OpVariable %fp_stype Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
		},
		{
			"array",
			"%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n"
			"%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n"
			"%cnull             = OpConstantNull %a4_v4f32\n",
			"%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n"
			"%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n"
			"%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%f1_val            = OpLoad %v4f32 %f1\n"
			"%f2_val            = OpLoad %v4f32 %f2\n"
			"%f3_val            = OpLoad %v4f32 %f3\n"
			"%t0                = OpFAdd %v4f32 %param1 %f_val\n"
			"%t1                = OpFAdd %v4f32 %t0 %f1_val\n"
			"%t2                = OpFAdd %v4f32 %t1 %f2_val\n"
			"%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
		},
		{
			"matrix",
			"%mat4x4_f32        = OpTypeMatrix %v4f32 4\n"
			"%cnull             = OpConstantNull %mat4x4_f32\n",
			// Our null matrix * any vector should result in a zero vector.
			"%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v\n"
		}
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, opConstantNullTests.get());
	}
	return opConstantNullTests.release();
}